

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

void __thiscall relive::ReLiveDB::deepFetch(ReLiveDB *this,Stream *stream,bool parentsOnly)

{
  long lVar1;
  long lVar2;
  is_equal_t<long_relive::Track::*,_long> c;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  byte in_DL;
  long in_RSI;
  where_t<sqlite_orm::internal::is_equal_t<long_relive::Track::*,_long>_> wVar7;
  unique_ptr<relive::Station,_std::default_delete<relive::Station>_> station;
  int i;
  lock_guard<std::recursive_mutex> lock;
  undefined1 in_stack_00000287;
  Station *in_stack_00000288;
  ReLiveDB *in_stack_00000290;
  mutex_type *in_stack_fffffffffffffeb8;
  expression_t<long_relive::Track::*> in_stack_fffffffffffffec0;
  vector<relive::Track,_std::allocator<relive::Track>_> *in_stack_fffffffffffffec8;
  __shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffed0;
  Station *in_stack_fffffffffffffee8;
  left_type in_stack_ffffffffffffff10;
  storage_t<_86c824a_> *in_stack_ffffffffffffff18;
  shared_ptr<relive::Station> local_c0;
  int local_a4;
  offset_in_Track_to_long local_70;
  binary_condition<long_relive::Track::*,_long> local_68;
  left_type local_58;
  right_type local_50;
  order_by_t<long_relive::Track::*> *in_stack_ffffffffffffffb8;
  where_t<sqlite_orm::internal::is_equal_t<long_relive::Track::*,_long>_> *in_stack_ffffffffffffffc0
  ;
  storage_t<_86c824a_> *in_stack_ffffffffffffffc8;
  
  if ((*(byte *)(in_RSI + 0x100) & 1) == 0) {
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffec0.t,
               in_stack_fffffffffffffeb8);
    if ((in_DL & 1) == 0) {
      storage_abi_cxx11_();
      local_70 = (offset_in_Track_to_long)
                 sqlite_orm::c<long_relive::Track::*>
                           ((offset_in_Track_to_long)in_stack_fffffffffffffeb8);
      local_68 = (binary_condition<long_relive::Track::*,_long>)
                 sqlite_orm::operator==(in_stack_fffffffffffffec0,(long)in_stack_fffffffffffffeb8);
      in_stack_ffffffffffffff18 = (storage_t<_86c824a_> *)local_68.r;
      c.super_binary_condition<long_relive::Track::*,_long>.r =
           (right_type)in_stack_fffffffffffffed0;
      c.super_binary_condition<long_relive::Track::*,_long>.l = (left_type)in_stack_fffffffffffffec8
      ;
      wVar7 = sqlite_orm::where<sqlite_orm::internal::is_equal_t<long_relive::Track::*,long>>(c);
      local_50 = wVar7.c.super_binary_condition<long_relive::Track::*,_long>.r;
      in_stack_ffffffffffffff10 = wVar7.c.super_binary_condition<long_relive::Track::*,_long>.l;
      local_58 = in_stack_ffffffffffffff10;
      sqlite_orm::order_by<long_relive::Track::*>
                ((offset_in_Track_to_long)in_stack_fffffffffffffeb8);
      sqlite_orm::internal::storage_t<$86c824a$>::
      get_all<relive::Track,_sqlite_orm::internal::where_t<sqlite_orm::internal::is_equal_t<long_relive::Track::*,_long>_>,_sqlite_orm::internal::order_by_t<long_relive::Track::*>_>
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::vector<relive::Track,_std::allocator<relive::Track>_>::operator=
                ((vector<relive::Track,_std::allocator<relive::Track>_> *)in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8);
      std::vector<relive::Track,_std::allocator<relive::Track>_>::~vector
                ((vector<relive::Track,_std::allocator<relive::Track>_> *)&stack0xffffffffffffffc8);
      sqlite_orm::internal::order_by_t<long_relive::Track::*>::~order_by_t
                ((order_by_t<long_relive::Track::*> *)0x1f2582);
      bVar3 = std::vector<relive::Track,_std::allocator<relive::Track>_>::empty
                        ((vector<relive::Track,_std::allocator<relive::Track>_> *)(in_RSI + 0x120));
      if (!bVar3) {
        local_a4 = 0;
        while( true ) {
          uVar4 = (ulong)local_a4;
          sVar5 = std::vector<relive::Track,_std::allocator<relive::Track>_>::size
                            ((vector<relive::Track,_std::allocator<relive::Track>_> *)
                             (in_RSI + 0x120));
          if (sVar5 - 1 <= uVar4) break;
          pvVar6 = std::vector<relive::Track,_std::allocator<relive::Track>_>::operator[]
                             ((vector<relive::Track,_std::allocator<relive::Track>_> *)
                              (in_RSI + 0x120),(long)(local_a4 + 1));
          lVar1 = pvVar6->_time;
          pvVar6 = std::vector<relive::Track,_std::allocator<relive::Track>_>::operator[]
                             ((vector<relive::Track,_std::allocator<relive::Track>_> *)
                              (in_RSI + 0x120),(long)local_a4);
          lVar2 = pvVar6->_time;
          pvVar6 = std::vector<relive::Track,_std::allocator<relive::Track>_>::operator[]
                             ((vector<relive::Track,_std::allocator<relive::Track>_> *)
                              (in_RSI + 0x120),(long)local_a4);
          pvVar6->_duration = lVar1 - lVar2;
          local_a4 = local_a4 + 1;
        }
        lVar1 = *(long *)(in_RSI + 0x80);
        in_stack_fffffffffffffed0 =
             (__shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x120);
        sVar5 = std::vector<relive::Track,_std::allocator<relive::Track>_>::size
                          ((vector<relive::Track,_std::allocator<relive::Track>_> *)(in_RSI + 0x120)
                          );
        pvVar6 = std::vector<relive::Track,_std::allocator<relive::Track>_>::operator[]
                           ((vector<relive::Track,_std::allocator<relive::Track>_> *)
                            in_stack_fffffffffffffed0,sVar5 - 1);
        in_stack_fffffffffffffee8 = (Station *)(lVar1 - pvVar6->_time);
        sVar5 = std::vector<relive::Track,_std::allocator<relive::Track>_>::size
                          ((vector<relive::Track,_std::allocator<relive::Track>_> *)(in_RSI + 0x120)
                          );
        pvVar6 = std::vector<relive::Track,_std::allocator<relive::Track>_>::operator[]
                           ((vector<relive::Track,_std::allocator<relive::Track>_> *)
                            (in_RSI + 0x120),sVar5 - 1);
        pvVar6->_duration = (int64_t)in_stack_fffffffffffffee8;
      }
    }
    storage_abi_cxx11_();
    sqlite_orm::internal::storage_t<$86c824a$>::get_pointer<relive::Station,_long>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<relive::Station,_std::default_delete<relive::Station>_> *)
                       0x1f278f);
    if (bVar3) {
      in_stack_fffffffffffffec0.t =
           (offset_in_Track_to_long)
           std::unique_ptr<relive::Station,_std::default_delete<relive::Station>_>::operator*
                     (in_stack_fffffffffffffec0.t);
      std::make_shared<relive::Station,relive::Station&>(in_stack_fffffffffffffee8);
      std::shared_ptr<relive::Station>::operator=
                ((shared_ptr<relive::Station> *)in_stack_fffffffffffffec0.t,
                 (shared_ptr<relive::Station> *)in_stack_fffffffffffffeb8);
      std::shared_ptr<relive::Station>::~shared_ptr(&local_c0);
    }
    else {
      std::__shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>::reset
                (in_stack_fffffffffffffed0);
    }
    std::unique_ptr<relive::Station,_std::default_delete<relive::Station>_>::~unique_ptr
              ((unique_ptr<relive::Station,_std::default_delete<relive::Station>_> *)
               in_stack_fffffffffffffec0.t);
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1f2839)
    ;
  }
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x138));
  if (bVar3) {
    std::__shared_ptr_access<relive::Station,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<relive::Station,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffec0.t);
    deepFetch(in_stack_00000290,in_stack_00000288,(bool)in_stack_00000287);
  }
  return;
}

Assistant:

void ReLiveDB::deepFetch(Stream& stream, bool parentsOnly)
{
    if(!stream._isLiveStream) {
        std::lock_guard<Mutex> lock{_mutex};
        if (!parentsOnly) {
            stream._tracks = storage().get_all<Track>(where(c(&Track::_streamId) == stream._id), order_by(&Track::_time));
            if (!stream._tracks.empty()) {
                for (int i = 0; i < stream._tracks.size() - 1; ++i) {
                    stream._tracks[i]._duration = stream._tracks[i + 1]._time - stream._tracks[i]._time;
                }
                stream._tracks[stream._tracks.size() - 1]._duration = stream._duration - stream._tracks[stream._tracks.size() - 1]._time;
            }
        }
        auto station = storage().get_pointer<Station>(stream._stationId);
        if (station) {
            stream._station = std::make_shared<Station>(*station);
        }
        else {
            stream._station.reset();
        }
    }
    if (stream._station) {
        deepFetch(*stream._station, true);
    }
}